

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void pfederc::fatal(char *file,int line,string *msg)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,file);
  poVar1 = std::operator<<(poVar1,':');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,line);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)msg);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

void pfederc::fatal(const char *file,
    int line, const std::string &msg) noexcept {
  std::cerr << file << ':' << line << ": " << msg << std::endl;
  std::exit(1);
}